

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O0

int32_t u_parseCodePoints(char *s,uint32_t *dest,int32_t destCapacity,UErrorCode *pErrorCode)

{
  UBool UVar1;
  ulong uVar2;
  int local_40;
  int32_t count;
  uint32_t value;
  char *end;
  UErrorCode *pErrorCode_local;
  uint32_t *puStack_20;
  int32_t destCapacity_local;
  uint32_t *dest_local;
  char *s_local;
  
  end = (char *)pErrorCode;
  pErrorCode_local._4_4_ = destCapacity;
  puStack_20 = dest;
  dest_local = (uint32_t *)s;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if (((dest_local == (uint32_t *)0x0) || (pErrorCode_local._4_4_ < 0)) ||
       ((0 < pErrorCode_local._4_4_ && (puStack_20 == (uint32_t *)0x0)))) {
      end[0] = '\x01';
      end[1] = '\0';
      end[2] = '\0';
      end[3] = '\0';
      s_local._4_4_ = 0;
    }
    else {
      local_40 = 0;
      while ((dest_local = (uint32_t *)u_skipWhitespace((char *)dest_local),
             (char)*dest_local != ';' && ((char)*dest_local != '\0'))) {
        uVar2 = strtoul((char *)dest_local,(char **)&count,0x10);
        if ((_count <= dest_local) ||
           ((((((char)*_count != ' ' && ((char)*_count != '\t')) && ((char)*_count != '\r')) &&
             ((((char)*_count != '\n' && ((char)*_count != ';')) && ((char)*_count != '\0')))) ||
            (0x10ffff < (uint)uVar2)))) {
          end[0] = '\t';
          end[1] = '\0';
          end[2] = '\0';
          end[3] = '\0';
          return 0;
        }
        if (local_40 < pErrorCode_local._4_4_) {
          puStack_20[local_40] = (uint)uVar2;
          local_40 = local_40 + 1;
        }
        else {
          end[0] = '\x0f';
          end[1] = '\0';
          end[2] = '\0';
          end[3] = '\0';
        }
        dest_local = _count;
      }
      s_local._4_4_ = local_40;
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_parseCodePoints(const char *s,
                  uint32_t *dest, int32_t destCapacity,
                  UErrorCode *pErrorCode) {
    char *end;
    uint32_t value;
    int32_t count;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(s==NULL || destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    count=0;
    for(;;) {
        s=u_skipWhitespace(s);
        if(*s==';' || *s==0) {
            return count;
        }

        /* read one code point */
        value=(uint32_t)uprv_strtoul(s, &end, 16);
        if(end<=s || (!U_IS_INV_WHITESPACE(*end) && *end!=';' && *end!=0) || value>=0x110000) {
            *pErrorCode=U_PARSE_ERROR;
            return 0;
        }

        /* append it to the destination array */
        if(count<destCapacity) {
            dest[count++]=value;
        } else {
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        }

        /* go to the following characters */
        s=end;
    }
}